

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O2

DancingNode * getMinColumn(DancingNode *header)

{
  DancingNode *pDVar1;
  s_DancingNode *psVar2;
  DancingNode *h;
  
  pDVar1 = header->right;
  psVar2 = pDVar1->right;
  do {
    if (psVar2->nodeCount < pDVar1->nodeCount) {
      pDVar1 = psVar2;
    }
    psVar2 = psVar2->right;
  } while (psVar2 != header);
  return pDVar1;
}

Assistant:

DancingNode *getMinColumn(DancingNode *header) 
{ 
    DancingNode *h = header;
    DancingNode *min_col = h->right; 
    h = h->right->right; 
    do
    { 
        if(h->nodeCount < min_col->nodeCount) 
        { 
            min_col = h; 
        } 
        h = h->right; 
    }while(h != header); 
  
    return min_col; 
}